

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  pointer p;
  size_type sVar1;
  size_t s;
  allocator<int> local_71;
  size_type local_70;
  int local_64;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_60;
  
  (**(code **)(*(long *)bb + 0x20))(bb,&local_70,8);
  sVar1 = local_70;
  local_64 = 0;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&local_60,0,&local_64,&local_71);
  Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::resize
            (v,sVar1,(value_type *)&local_60);
  local_60.m_end = local_60.m_begin;
  if (local_60.m_dynamic_data != (pointer)0x0) {
    operator_delete(local_60.m_dynamic_data,local_60.m_dynamic_capacity << 2);
  }
  if (local_70 != 0) {
    p = (v->super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>)._M_impl.
        super__Vector_impl_data._M_start;
    sVar1 = local_70;
    do {
      Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,&p->super_DynamicPoint<int,_4UL>);
      p = p + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }